

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

int __thiscall
sznet::net::Connector::connect(Connector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  unsigned_short uVar1;
  sz_sock sockfd_00;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  sockaddr *addr;
  LogStream *pLVar3;
  self *psVar4;
  SourceFile file;
  SourceFile file_00;
  int local_2004;
  undefined1 local_1ff0 [12];
  Logger local_1fe0;
  undefined1 local_1000 [12];
  Logger local_ff0;
  int local_1c;
  int local_18;
  int savedErrno;
  int ret;
  sz_sock sockfd;
  Connector *this_local;
  
  _ret = this;
  uVar1 = InetAddress::family(&this->m_serverAddr);
  sockfd_00 = sockets::sz_sock_createnonblockingordie((uint)uVar1);
  savedErrno = sockfd_00;
  addr = InetAddress::getSockAddr(&this->m_serverAddr);
  local_18 = sockets::sz_sock_connect(sockfd_00,addr);
  if (local_18 == 0) {
    local_2004 = 0;
  }
  else {
    local_2004 = sz_getlasterr();
  }
  local_1c = local_2004;
  switch(local_2004) {
  case 0:
  case 4:
  case 0x6a:
  case 0x73:
    connecting(this,savedErrno);
    iVar2 = extraout_EAX;
    break;
  case 1:
  case 9:
  case 0xd:
  case 0xe:
  case 0x58:
  case 0x61:
  case 0x72:
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1000,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1000._0_8_;
    file.m_size = local_1000._8_4_;
    Logger::Logger(&local_ff0,file,0x6e,false);
    pLVar3 = Logger::stream(&local_ff0);
    psVar4 = LogStream::operator<<(pLVar3,"connect error in Connector::startInLoop ");
    LogStream::operator<<(psVar4,local_1c);
    Logger::~Logger(&local_ff0);
    iVar2 = sockets::sz_closesocket(savedErrno);
    break;
  default:
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1ff0,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_1ff0._0_8_;
    file_00.m_size = local_1ff0._8_4_;
    Logger::Logger(&local_1fe0,file_00,0x72,false);
    pLVar3 = Logger::stream(&local_1fe0);
    psVar4 = LogStream::operator<<(pLVar3,"Unexpected error in Connector::startInLoop ");
    LogStream::operator<<(psVar4,local_1c);
    Logger::~Logger(&local_1fe0);
    iVar2 = sockets::sz_closesocket(savedErrno);
    break;
  case 0xb:
  case 0x62:
  case 99:
  case 0x65:
  case 0x6f:
    retry(this,savedErrno);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void Connector::connect()
{
	sockets::sz_sock sockfd = sockets::sz_sock_createnonblockingordie(m_serverAddr.family());
	int ret = sockets::sz_sock_connect(sockfd, m_serverAddr.getSockAddr());
	int savedErrno = (ret == 0) ? 0 : sz_getlasterr();
	switch (savedErrno)
	{
	// ���ӳɹ�
	case 0:
	case sz_err_inprogress:
	// ���ﲻ�԰ɣ�
	case sz_err_eintr:
	case sz_err_eisconn:
#ifdef SZ_OS_WINDOWS
	case sz_err_wouldblock:
#endif
		connecting(sockfd);
		break;
#ifdef SZ_OS_LINUX
	case sz_err_again:
#endif
	case sz_err_eaddrinuse:
	case sz_err_eaddrnotavail:
	case sz_err_econnrefused:
	case sz_err_enetunreach:
		retry(sockfd);
		break;
	case sz_err_eacces:
#ifdef SZ_OS_LINUX
	case sz_err_eperm:
#endif
	case sz_err_eafnosupport:
	case sz_err_ealready:
	case sz_err_ebadf:
	case sz_err_efault:
	case sz_err_enotsock:
		LOG_SYSERR << "connect error in Connector::startInLoop " << savedErrno;
		sockets::sz_closesocket(sockfd);
		break;
	default:
		LOG_SYSERR << "Unexpected error in Connector::startInLoop " << savedErrno;
		sockets::sz_closesocket(sockfd);
		break;
	}
}